

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O3

_Bool upvalue_lookup(ch_compilation *comp,ch_scope *scope,ch_lexeme name,uint8_t *index)

{
  ch_scope *scope_00;
  _Bool _Var1;
  uint8_t uVar2;
  ulong in_RAX;
  uint8_t offset;
  uint8_t upvalue;
  undefined8 uStack_38;
  
  scope_00 = scope->parent;
  if (scope_00 == (ch_scope *)0x0) {
    _Var1 = false;
  }
  else {
    uStack_38 = in_RAX;
    _Var1 = scope_lookup(scope_00,name,(uint8_t *)((long)&uStack_38 + 6));
    if (_Var1) {
      uVar2 = add_upvalue(comp,scope,uStack_38._6_1_,true);
      *index = uVar2;
      scope->parent->locals[uStack_38 >> 0x30 & 0xff].is_captured = true;
      _Var1 = true;
    }
    else {
      _Var1 = upvalue_lookup(comp,scope_00,name,(uint8_t *)((long)&uStack_38 + 7));
      if (_Var1) {
        uVar2 = add_upvalue(comp,scope,uStack_38._7_1_,false);
        *index = uVar2;
      }
    }
  }
  return _Var1;
}

Assistant:

bool upvalue_lookup(ch_compilation* comp, ch_scope *scope, ch_lexeme name, uint8_t *index) {
  if (scope->parent == NULL) return false;

  uint8_t offset;
  if(scope_lookup(scope->parent, name, &offset)) {
    *index = add_upvalue(comp, scope, offset, true);
    scope->parent->locals[offset].is_captured = true;
    return true;
  }

  uint8_t upvalue;
  if(upvalue_lookup(comp, scope->parent, name, &upvalue)) {
    *index = add_upvalue(comp, scope, upvalue, false);
    return true;
  }

  return false;
}